

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

uint8_t * __thiscall
icu_63::ResourceDataValue::getBinary(ResourceDataValue *this,int32_t *length,UErrorCode *errorCode)

{
  uint uVar1;
  anon_struct_8_2_41692a41 *paVar2;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((this->res & 0xf0000000) == 0x10000000) {
      uVar1 = this->res & 0xfffffff;
      if (uVar1 == 0) {
        paVar2 = &gEmpty32;
      }
      else {
        paVar2 = (anon_struct_8_2_41692a41 *)((ulong)(uVar1 << 2) + (long)this->pResData->pRoot);
      }
      *length = paVar2->length;
      return (uint8_t *)&paVar2->res;
    }
    *length = 0;
    *errorCode = U_RESOURCE_TYPE_MISMATCH;
  }
  return (uint8_t *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }